

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O2

void __thiscall mp::NLSolution::~NLSolution(NLSolution *this)

{
  std::
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  ::~_Rb_tree((_Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
               *)&this->suffixes_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->y_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->x_).super__Vector_base<double,_std::allocator<double>_>);
  std::__cxx11::string::~string((string *)&this->solve_message_);
  return;
}

Assistant:

operator bool() const { return solve_result_ > -2; }